

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

RegSlot __thiscall IRBuilder::GetEnvRegForInnerFrameDisplay(IRBuilder *this)

{
  JITTimeFunctionBody *this_00;
  RegSlot local_14;
  RegSlot envReg;
  IRBuilder *this_local;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  local_14 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this_00);
  if (local_14 == 0xffffffff) {
    local_14 = GetEnvReg(this);
  }
  return local_14;
}

Assistant:

Js::RegSlot
IRBuilder::GetEnvRegForInnerFrameDisplay() const
{
    Js::RegSlot envReg = m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg();
    if (envReg == Js::Constants::NoRegister)
    {
        envReg = this->GetEnvReg();
    }

    return envReg;
}